

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_ech_encode_config
              (ptls_buffer_t *buf,uint8_t config_id,ptls_hpke_kem_t *kem,ptls_iovec_t public_key,
              ptls_hpke_cipher_suite_t **ciphers,uint8_t max_name_length,char *public_name)

{
  ushort uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  size_t len;
  long lVar5;
  uint8_t local_42;
  ushort local_41;
  ushort local_3f;
  uint8_t local_3d;
  ushort local_3c [2];
  size_t local_38;
  
  local_3c[1] = 0xdfe;
  iVar3 = ptls_buffer__do_pushv(buf,local_3c + 1,2);
  if ((iVar3 == 0) && (iVar3 = ptls_buffer__do_pushv(buf,"",2), iVar3 == 0)) {
    local_38 = buf->off;
    local_3d = config_id;
    iVar3 = ptls_buffer__do_pushv(buf,&local_3d,1);
    if (iVar3 == 0) {
      local_3c[0] = kem->id << 8 | kem->id >> 8;
      iVar3 = ptls_buffer__do_pushv(buf,local_3c,2);
      if ((iVar3 == 0) && (iVar3 = ptls_buffer__do_pushv(buf,"",2), iVar3 == 0)) {
        sVar2 = buf->off;
        iVar3 = ptls_buffer__do_pushv(buf,public_key.base,public_key.len);
        if (iVar3 == 0) {
          uVar4 = buf->off - sVar2;
          if (uVar4 < 0x10000) {
            buf->base[sVar2 - 2] = (uint8_t)(uVar4 >> 8);
            buf->base[sVar2 - 1] = (uint8_t)uVar4;
            iVar3 = ptls_buffer__do_pushv(buf,"",2);
            if (iVar3 == 0) {
              sVar2 = buf->off;
              do {
                if (*ciphers == (ptls_hpke_cipher_suite_t *)0x0) {
                  uVar4 = buf->off - sVar2;
                  if (uVar4 < 0x10000) {
                    buf->base[sVar2 - 2] = (uint8_t)(uVar4 >> 8);
                    buf->base[sVar2 - 1] = (uint8_t)uVar4;
                    local_42 = max_name_length;
                    iVar3 = ptls_buffer__do_pushv(buf,&local_42,1);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    iVar3 = ptls_buffer__do_pushv(buf,"",1);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    sVar2 = buf->off;
                    len = strlen(public_name);
                    iVar3 = ptls_buffer__do_pushv(buf,public_name,len);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    uVar4 = buf->off - sVar2;
                    if (uVar4 < 0x100) {
                      buf->base[sVar2 - 1] = (uint8_t)uVar4;
                      iVar3 = ptls_buffer__do_pushv(buf,"",2);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      sVar2 = buf->off;
                      for (lVar5 = -2; lVar5 != 0; lVar5 = lVar5 + 1) {
                        buf->base[lVar5 + sVar2] = '\0';
                      }
                      uVar4 = buf->off - local_38;
                      if (0xffff < uVar4) {
                        return 0x20c;
                      }
                      buf->base[local_38 - 2] = (uint8_t)(uVar4 >> 8);
                      buf->base[local_38 - 1] = (uint8_t)uVar4;
                      return 0;
                    }
                  }
                  goto LAB_0010c340;
                }
                uVar1 = ((*ciphers)->id).kdf;
                local_3f = uVar1 << 8 | uVar1 >> 8;
                iVar3 = ptls_buffer__do_pushv(buf,&local_3f,2);
                if (iVar3 != 0) {
                  return iVar3;
                }
                uVar1 = ((*ciphers)->id).aead;
                local_41 = uVar1 << 8 | uVar1 >> 8;
                iVar3 = ptls_buffer__do_pushv(buf,&local_41,2);
                ciphers = ciphers + 1;
              } while (iVar3 == 0);
            }
          }
          else {
LAB_0010c340:
            iVar3 = 0x20c;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int ptls_ech_encode_config(ptls_buffer_t *buf, uint8_t config_id, ptls_hpke_kem_t *kem, ptls_iovec_t public_key,
                           ptls_hpke_cipher_suite_t **ciphers, uint8_t max_name_length, const char *public_name)
{
    int ret;

    ptls_buffer_push16(buf, PTLS_ECH_CONFIG_VERSION);
    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, config_id);
        ptls_buffer_push16(buf, kem->id);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, public_key.base, public_key.len); });
        ptls_buffer_push_block(buf, 2, {
            for (size_t i = 0; ciphers[i] != NULL; ++i) {
                ptls_buffer_push16(buf, ciphers[i]->id.kdf);
                ptls_buffer_push16(buf, ciphers[i]->id.aead);
            }
        });
        ptls_buffer_push(buf, max_name_length);
        ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, public_name, strlen(public_name)); });
        ptls_buffer_push_block(buf, 2, {/* extensions */});
    });

Exit:
    return ret;
}